

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::ExplicitUniformLocationCaseBase::setUniform
          (ExplicitUniformLocationCaseBase *this,Uniform *uniform,CompiledProgram *program)

{
  GLuint GVar1;
  GLint location;
  ulong uVar2;
  size_t sVar3;
  bool bVar4;
  size_type sVar5;
  const_reference pvVar6;
  CompiledProgram *pCVar7;
  const_reference uniform_00;
  string *psVar8;
  GLchar *name_00;
  GLfloat *pGVar9;
  GLint *pGVar10;
  GLuint *pGVar11;
  bool local_219;
  int local_204;
  string local_200 [4];
  int arrayElem;
  undefined1 local_1e0 [8];
  ostringstream name;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  GLint local_3c;
  ulong uStack_38;
  GLint loc;
  size_t j;
  size_t i;
  CompiledProgram *pCStack_20;
  bool used;
  CompiledProgram *program_local;
  Uniform *uniform_local;
  ExplicitUniformLocationCaseBase *this_local;
  
  i._7_1_ = false;
  pCStack_20 = program;
  program_local = (CompiledProgram *)uniform;
  uniform_local = (Uniform *)this;
  for (j = 0; sVar3 = j,
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&pCStack_20->stages),
      sVar3 < sVar5; j = j + 1) {
    pCVar7 = program_local + 4;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&pCStack_20->stages,j);
    bVar4 = DefOccurence::occurs
                      ((DefOccurence *)
                       ((long)&(pCVar7->stages).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 4),*pvVar6);
    local_219 = false;
    if (bVar4) {
      pCVar7 = program_local + 5;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&pCStack_20->stages,j);
      local_219 = DefOccurence::occurs((DefOccurence *)pCVar7,*pvVar6);
    }
    i._7_1_ = (i._7_1_ & 1) != 0 || local_219 != false;
  }
  if ((i._7_1_ & 1) != 0) {
    bVar4 = UniformType::isStruct((UniformType *)program_local);
    if (bVar4) {
      for (uStack_38 = 0; uVar2 = uStack_38,
          sVar5 = std::
                  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                  ::size((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                          *)(program_local + 0xc)), uVar2 < sVar5; uStack_38 = uStack_38 + 1) {
        uniform_00 = std::
                     vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                     ::operator[]((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                   *)(program_local + 0xc),uStack_38);
        setUniform(this,uniform_00,pCStack_20);
      }
    }
    else {
      pCVar7 = program_local + 4;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_58,&pCStack_20->stages);
      bVar4 = LayoutSpecifierBase::isImplicit
                        ((LayoutSpecifierBase *)
                         &(pCVar7->stages).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish,&local_58);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_58);
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
        psVar8 = glcts::(anonymous_namespace)::Uniform::getName_abi_cxx11_((Uniform *)program_local)
        ;
        std::operator<<((ostream *)local_1e0,(string *)psVar8);
        UniformType::streamArrayStr((UniformType *)program_local,(ostringstream *)local_1e0,0);
        GVar1 = pCStack_20->name;
        std::__cxx11::ostringstream::str();
        name_00 = (GLchar *)std::__cxx11::string::c_str();
        local_3c = glu::CallLogWrapper::glGetUniformLocation
                             (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,
                              name_00);
        std::__cxx11::string::~string(local_200);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
      }
      else {
        local_3c = *(GLint *)&program_local[4].stages.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
      }
      for (local_204 = 0; location = local_3c, local_204 < (int)program_local[1].name;
          local_204 = local_204 + 1) {
        GVar1 = program_local->name;
        if (GVar1 == 0x1404) {
LAB_0137bf1e:
          pGVar10 = (GLint *)UniformValue::getPtr
                                       ((UniformValue *)&program_local[5].stages,local_204);
          glu::CallLogWrapper::glUniform1i
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,location,
                     *pGVar10);
        }
        else if (GVar1 == 0x1405) {
          pGVar11 = (GLuint *)
                    UniformValue::getPtr((UniformValue *)&program_local[5].stages,local_204);
          glu::CallLogWrapper::glUniform1ui
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,location,
                     *pGVar11);
        }
        else if (GVar1 == 0x1406) {
          pGVar9 = (GLfloat *)
                   UniformValue::getPtr((UniformValue *)&program_local[5].stages,local_204);
          glu::CallLogWrapper::glUniform1f
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,location,
                     *pGVar9);
        }
        else if (GVar1 == 0x8b50) {
          pGVar9 = (GLfloat *)
                   UniformValue::getPtr((UniformValue *)&program_local[5].stages,local_204);
          glu::CallLogWrapper::glUniform2fv
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,location,1,
                     pGVar9);
        }
        else if (GVar1 == 0x8b51) {
          pGVar9 = (GLfloat *)
                   UniformValue::getPtr((UniformValue *)&program_local[5].stages,local_204);
          glu::CallLogWrapper::glUniform3fv
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,location,1,
                     pGVar9);
        }
        else if (GVar1 == 0x8b52) {
          pGVar9 = (GLfloat *)
                   UniformValue::getPtr((UniformValue *)&program_local[5].stages,local_204);
          glu::CallLogWrapper::glUniform4fv
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,location,1,
                     pGVar9);
        }
        else if (GVar1 == 0x8b53) {
          pGVar10 = (GLint *)UniformValue::getPtr
                                       ((UniformValue *)&program_local[5].stages,local_204);
          glu::CallLogWrapper::glUniform2iv
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,location,1,
                     pGVar10);
        }
        else if (GVar1 == 0x8b54) {
          pGVar10 = (GLint *)UniformValue::getPtr
                                       ((UniformValue *)&program_local[5].stages,local_204);
          glu::CallLogWrapper::glUniform3iv
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,location,1,
                     pGVar10);
        }
        else if (GVar1 == 0x8b55) {
          pGVar10 = (GLint *)UniformValue::getPtr
                                       ((UniformValue *)&program_local[5].stages,local_204);
          glu::CallLogWrapper::glUniform4iv
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,location,1,
                     pGVar10);
        }
        else if (GVar1 == 0x8b5a) {
          pGVar9 = (GLfloat *)
                   UniformValue::getPtr((UniformValue *)&program_local[5].stages,local_204);
          glu::CallLogWrapper::glUniformMatrix2fv
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,location,1,'\0'
                     ,pGVar9);
        }
        else if (GVar1 == 0x8b5b) {
          pGVar9 = (GLfloat *)
                   UniformValue::getPtr((UniformValue *)&program_local[5].stages,local_204);
          glu::CallLogWrapper::glUniformMatrix3fv
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,location,1,'\0'
                     ,pGVar9);
        }
        else if (GVar1 == 0x8b5c) {
          pGVar9 = (GLfloat *)
                   UniformValue::getPtr((UniformValue *)&program_local[5].stages,local_204);
          glu::CallLogWrapper::glUniformMatrix4fv
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,location,1,'\0'
                     ,pGVar9);
        }
        else {
          if (GVar1 == 0x8b5e) goto LAB_0137bf1e;
          if (GVar1 == 0x8b65) {
            pGVar9 = (GLfloat *)
                     UniformValue::getPtr((UniformValue *)&program_local[5].stages,local_204);
            glu::CallLogWrapper::glUniformMatrix2x3fv
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,location,1,
                       '\0',pGVar9);
          }
          else if (GVar1 == 0x8b66) {
            pGVar9 = (GLfloat *)
                     UniformValue::getPtr((UniformValue *)&program_local[5].stages,local_204);
            glu::CallLogWrapper::glUniformMatrix2x4fv
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,location,1,
                       '\0',pGVar9);
          }
          else if (GVar1 == 0x8b67) {
            pGVar9 = (GLfloat *)
                     UniformValue::getPtr((UniformValue *)&program_local[5].stages,local_204);
            glu::CallLogWrapper::glUniformMatrix3x2fv
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,location,1,
                       '\0',pGVar9);
          }
          else if (GVar1 == 0x8b68) {
            pGVar9 = (GLfloat *)
                     UniformValue::getPtr((UniformValue *)&program_local[5].stages,local_204);
            glu::CallLogWrapper::glUniformMatrix3x4fv
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,location,1,
                       '\0',pGVar9);
          }
          else if (GVar1 == 0x8b69) {
            pGVar9 = (GLfloat *)
                     UniformValue::getPtr((UniformValue *)&program_local[5].stages,local_204);
            glu::CallLogWrapper::glUniformMatrix4x2fv
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,location,1,
                       '\0',pGVar9);
          }
          else {
            if (GVar1 != 0x8b6a) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                            ,0x5e1,
                            "void glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::setUniform(const Uniform &, const CompiledProgram &)"
                           );
            }
            pGVar9 = (GLfloat *)
                     UniformValue::getPtr((UniformValue *)&program_local[5].stages,local_204);
            glu::CallLogWrapper::glUniformMatrix4x3fv
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,location,1,
                       '\0',pGVar9);
          }
        }
        local_3c = local_3c + 1;
      }
    }
  }
  return;
}

Assistant:

void setUniform(const Uniform& uniform, const CompiledProgram& program)
	{

		bool used = false;
		for (size_t i = 0; i < program.stages.size(); i++)
		{
			used |= uniform.declOccurence.occurs(program.stages[i]) && uniform.usageOccurence.occurs(program.stages[i]);
		}
		if (!used)
			return;

		if (uniform.type.isStruct())
		{
			for (size_t j = 0; j < uniform.childUniforms.size(); j++)
			{
				setUniform(uniform.childUniforms[j], program);
			}
		}
		else
		{
			GLint loc;
			if (uniform.location.isImplicit(program.stages))
			{
				std::ostringstream name;
				name << uniform.getName();
				uniform.type.streamArrayStr(name, 0);
				loc = glGetUniformLocation(program.name, name.str().c_str());
			}
			else
			{
				loc = uniform.location.val;
			}

			for (int arrayElem = 0; arrayElem < uniform.type.arraySize; arrayElem++)
			{
				switch (uniform.type.enumType)
				{
				case GL_FLOAT:
					glUniform1f(loc, *(GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_VEC2:
					glUniform2fv(loc, 1, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_VEC3:
					glUniform3fv(loc, 1, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_VEC4:
					glUniform4fv(loc, 1, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT2:
					glUniformMatrix2fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT3:
					glUniformMatrix3fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT4:
					glUniformMatrix4fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT2x3:
					glUniformMatrix2x3fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT4x3:
					glUniformMatrix4x3fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT2x4:
					glUniformMatrix2x4fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT3x4:
					glUniformMatrix3x4fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT3x2:
					glUniformMatrix3x2fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT4x2:
					glUniformMatrix4x2fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_INT:
				case GL_SAMPLER_2D:
					glUniform1i(loc, *(GLint*)uniform.value.getPtr(arrayElem));
					break;
				case GL_INT_VEC2:
					glUniform2iv(loc, 1, (GLint*)uniform.value.getPtr(arrayElem));
					break;
				case GL_INT_VEC3:
					glUniform3iv(loc, 1, (GLint*)uniform.value.getPtr(arrayElem));
					break;
				case GL_INT_VEC4:
					glUniform4iv(loc, 1, (GLint*)uniform.value.getPtr(arrayElem));
					break;
				case GL_UNSIGNED_INT:
					glUniform1ui(loc, *(GLuint*)uniform.value.getPtr(arrayElem));
					break;
				default:
					assert(0);
				}
				loc++;
			}
		}
	}